

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall argo::lexer::read_matching(lexer *this,char *s)

{
  char cVar1;
  int iVar2;
  json_parser_exception *this_00;
  size_t byte_index;
  char *pcVar3;
  
  if (*s != '\0') {
    pcVar3 = s + 1;
    do {
      iVar2 = (*this->m_reader->_vptr_reader[2])();
      if ((char)iVar2 != pcVar3[-1]) {
        this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
        byte_index = reader::get_byte_index(this->m_reader);
        json_parser_exception::json_parser_exception
                  (this_00,invalid_character_e,(char)iVar2,byte_index);
        __cxa_throw(this_00,&json_parser_exception::typeinfo,std::exception::~exception);
      }
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void lexer::read_matching(const char *s)
{
    int i = 0;
    while (s[i] != 0)
    {
        char c = m_reader.next();

        if (c != s[i++])
        {
            throw json_parser_exception(json_parser_exception::invalid_character_e, c, m_reader.get_byte_index());
        }
    }
}